

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O0

void xc_lda_initalize(xc_func_type *func,size_t np,xc_lda_out_params *out)

{
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  xc_dimensions *dim;
  
  if (*in_RDX != 0) {
    memset((void *)*in_RDX,0,in_RSI * 8 * (long)*(int *)(in_RDI + 0x58));
  }
  if (in_RDX[1] != 0) {
    memset((void *)in_RDX[1],0,in_RSI * 8 * (long)*(int *)(in_RDI + 0x5c));
  }
  if (in_RDX[2] != 0) {
    memset((void *)in_RDX[2],0,in_RSI * 8 * (long)*(int *)(in_RDI + 0x6c));
  }
  if (in_RDX[3] != 0) {
    memset((void *)in_RDX[3],0,in_RSI * 8 * (long)*(int *)(in_RDI + 0x94));
  }
  if (in_RDX[4] != 0) {
    memset((void *)in_RDX[4],0,in_RSI * 8 * (long)*(int *)(in_RDI + 0xe4));
  }
  return;
}

Assistant:

void
xc_lda_initalize(const xc_func_type *func, size_t np, xc_lda_out_params *out)
{
  const xc_dimensions *dim = &(func->dim);

  /* initialize output */
  if(out->zk != NULL)
    libxc_memset(out->zk,     0, np*sizeof(double)*dim->zk);

  if(out->vrho != NULL)
    libxc_memset(out->vrho,   0, np*sizeof(double)*dim->vrho);

  if(out->v2rho2 != NULL)
    libxc_memset(out->v2rho2, 0, np*sizeof(double)*dim->v2rho2);

  if(out->v3rho3 != NULL)
    libxc_memset(out->v3rho3, 0, np*sizeof(double)*dim->v3rho3);

  if(out->v4rho4 != NULL)
    libxc_memset(out->v4rho4, 0, np*sizeof(double)*dim->v4rho4);
}